

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,uint32_t *value)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte bVar3;
  StreamReader *pSVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  undefined8 *puVar9;
  size_type *psVar10;
  ulong uVar11;
  ulong uVar12;
  char *pcVar13;
  _Alloc_hider _Var14;
  undefined8 uVar15;
  char *pcVar16;
  uint __len;
  uint32_t uVar17;
  uint uVar18;
  ulong uVar19;
  byte *pbVar20;
  uint uVar21;
  int iVar22;
  char c;
  string __str;
  char sc;
  stringstream ss;
  string local_258;
  string local_238;
  long *local_218 [2];
  long local_208 [2];
  char local_1f8;
  undefined7 uStack_1f7;
  long local_1e8 [2];
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  bVar8 = Char1(this,&local_1f8);
  if (bVar8) {
    piVar1 = &(this->_curr_cursor).col;
    *piVar1 = *piVar1 + 1;
    bVar8 = true;
    if (local_1f8 == '+') {
      bVar6 = false;
      bVar7 = true;
    }
    else if (local_1f8 == '-') {
      bVar7 = true;
      bVar6 = true;
    }
    else {
      if (9 < (byte)(local_1f8 - 0x30U)) {
        uVar21 = (uint)local_1f8;
        uVar18 = -uVar21;
        if (0 < (int)uVar21) {
          uVar18 = uVar21;
        }
        __len = 1;
        if (9 < uVar18) {
          __len = 3 - (uVar18 < 100);
        }
        local_218[0] = local_208;
        ::std::__cxx11::string::_M_construct((ulong)local_218,(char)__len - (local_1f8 >> 7));
        ::std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((long)local_218[0] + (ulong)(uVar21 >> 0x1f)),__len,uVar18);
        puVar9 = (undefined8 *)
                 ::std::__cxx11::string::replace((ulong)local_218,0,(char *)0x0,0x440fd0);
        psVar10 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_258.field_2._M_allocated_capacity = *psVar10;
          local_258.field_2._8_8_ = puVar9[3];
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        }
        else {
          local_258.field_2._M_allocated_capacity = *psVar10;
          local_258._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_258._M_string_length = puVar9[1];
        *puVar9 = psVar10;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)::std::__cxx11::string::append((char *)&local_258);
        psVar10 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_238.field_2._M_allocated_capacity = *psVar10;
          local_238.field_2._8_8_ = puVar9[3];
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        }
        else {
          local_238.field_2._M_allocated_capacity = *psVar10;
          local_238._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_238._M_string_length = puVar9[1];
        *puVar9 = psVar10;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        PushError(this,&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        if (local_218[0] != local_208) {
          operator_delete(local_218[0],local_208[0] + 1);
        }
        goto LAB_003f5a01;
      }
      bVar7 = false;
      bVar6 = false;
    }
    local_238._M_dataplus._M_p._0_1_ = local_1f8;
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_238,1);
  }
  else {
LAB_003f5a01:
    bVar7 = false;
    bVar6 = false;
    bVar8 = false;
  }
  if (bVar8) {
    if (bVar6) {
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_238,"Unsigned value expected but got \'-\' sign.","");
      PushError(this,&local_238);
      uVar15 = local_238.field_2._M_allocated_capacity;
      _Var14._M_p = local_238._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) goto LAB_003f5c25;
    }
    else {
      do {
        pSVar4 = this->_sr;
        uVar11 = pSVar4->idx_;
        if ((pSVar4->length_ <= uVar11) || (pSVar4->binary_[uVar11] == '\0')) goto LAB_003f5ae4;
        bVar8 = Char1(this,(char *)&local_258);
        uVar11 = 1;
        if (bVar8) {
          if ((byte)((char)local_258._M_dataplus._M_p - 0x30U) < 10) {
            local_238._M_dataplus._M_p._0_1_ = (char)local_258._M_dataplus._M_p;
            ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_238,1);
            uVar11 = 0;
          }
          else {
            pSVar4 = this->_sr;
            uVar11 = 3;
            if ((0 < (long)pSVar4->idx_) && (uVar12 = pSVar4->idx_ - 1, uVar12 <= pSVar4->length_))
            {
              pSVar4->idx_ = uVar12;
            }
          }
        }
      } while ((int)uVar11 == 0);
      if ((int)uVar11 == 3) {
LAB_003f5ae4:
        if (bVar7) {
          ::std::__cxx11::stringbuf::str();
          bVar8 = local_238._M_string_length == 1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          bVar8 = false;
        }
        if (bVar8) {
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_258,"Integer value expected but got sign character only.\n",""
                    );
          PushError(this,&local_258);
          uVar15 = local_258.field_2._M_allocated_capacity;
          _Var14._M_p = local_258._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
LAB_003f5c25:
            operator_delete(_Var14._M_p,uVar15 + 1);
          }
        }
        else {
          ::std::__cxx11::stringbuf::str();
          if (local_258._M_string_length < 2) {
            bVar8 = false;
          }
          else {
            ::std::__cxx11::stringbuf::str();
            bVar8 = (char)*local_218[0] == '0';
            if (local_218[0] != local_208) {
              operator_delete(local_218[0],local_208[0] + 1);
            }
          }
          paVar2 = &local_258.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != paVar2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          }
          if (!bVar8) {
            ::std::__cxx11::stringbuf::str();
            _Var14._M_p = local_258._M_dataplus._M_p;
            ::std::__cxx11::stringbuf::str();
            lVar5 = CONCAT71(uStack_1f7,local_1f8);
            ::std::__cxx11::stringbuf::str();
            pbVar20 = (byte *)(lVar5 + local_1d0);
            uVar17 = 0;
            iVar22 = -1;
            if ((byte *)_Var14._M_p != pbVar20) {
              if (*_Var14._M_p == 0x2d) {
                iVar22 = -2;
              }
              else {
                if (*_Var14._M_p == 0x2b) {
                  _Var14._M_p = _Var14._M_p + 1;
                }
                if ((byte *)_Var14._M_p != pbVar20) {
                  iVar22 = 0;
                  uVar12 = 0;
                  do {
                    bVar3 = *_Var14._M_p;
                    uVar18 = (uint)uVar12;
                    uVar19 = uVar12;
                    if (((ulong)bVar3 < 0x21) && ((0x100003e01U >> ((ulong)bVar3 & 0x3f) & 1) != 0))
                    {
                      iVar22 = 0;
                      bVar8 = false;
                    }
                    else {
                      if ((byte)(bVar3 - 0x3a) < 0xf6) {
                        iVar22 = -1;
                      }
                      else {
                        if ((uVar18 < 0x1999999a) &&
                           (uVar18 != 0x19999999 || (byte)(bVar3 - 0x30) < 6)) {
                          bVar8 = true;
                          uVar12 = uVar11;
                          uVar19 = (ulong)((uint)(byte)(bVar3 - 0x30) + uVar18 * 10);
                          goto LAB_003f5d02;
                        }
                        iVar22 = -3;
                      }
                      bVar8 = false;
                    }
LAB_003f5d02:
                    uVar17 = (uint32_t)uVar19;
                    if (!bVar8) {
                      uVar17 = (uint32_t)uVar12;
                      goto LAB_003f5d63;
                    }
                    _Var14._M_p = _Var14._M_p + 1;
                    uVar11 = uVar12;
                    uVar12 = uVar19;
                  } while (_Var14._M_p < pbVar20);
                  iVar22 = 0;
                }
              }
            }
LAB_003f5d63:
            if (local_1d8 != local_1c8) {
              operator_delete(local_1d8,local_1c8[0] + 1);
            }
            paVar2 = &local_258.field_2;
            if ((long *)CONCAT71(uStack_1f7,local_1f8) != local_1e8) {
              operator_delete((long *)CONCAT71(uStack_1f7,local_1f8),local_1e8[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_258._M_dataplus._M_p != paVar2) {
              operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1
                             );
            }
            bVar8 = iVar22 == 0;
            if (bVar8) {
              *value = uVar17;
            }
            else {
              if (iVar22 == -3) {
                pcVar16 = "Integer value overflows.\n";
                pcVar13 = "";
              }
              else if (iVar22 == -2) {
                pcVar16 = "Negative sign `-` specified for uint32 integer.\n";
                pcVar13 = "";
              }
              else if (iVar22 == -1) {
                pcVar16 = "Not an 32bit unsigned integer literal.\n";
                pcVar13 = "";
              }
              else {
                pcVar16 = "Invalid integer literal\n";
                pcVar13 = "";
              }
              local_258._M_dataplus._M_p = (pointer)paVar2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_258,pcVar16,pcVar13);
              PushError(this,&local_258);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_258._M_dataplus._M_p != paVar2) {
                operator_delete(local_258._M_dataplus._M_p,
                                local_258.field_2._M_allocated_capacity + 1);
              }
            }
            goto LAB_003f5c2f;
          }
          local_258._M_dataplus._M_p = (pointer)paVar2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_258,"Zero padded integer value is not allowed.\n","");
          PushError(this,&local_258);
          uVar15 = local_258.field_2._M_allocated_capacity;
          _Var14._M_p = local_258._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != paVar2) goto LAB_003f5c25;
        }
      }
    }
  }
  bVar8 = false;
LAB_003f5c2f:
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return bVar8;
}

Assistant:

bool AsciiParser::ReadBasicType(uint32_t *value) {
  std::stringstream ss;

  // head character
  bool has_sign = false;
  bool negative = false;
  {
    char sc;
    if (!Char1(&sc)) {
      return false;
    }
    _curr_cursor.col++;

    // sign or [0-9]
    if (sc == '+') {
      negative = false;
      has_sign = true;
    } else if (sc == '-') {
      negative = true;
      has_sign = true;
    } else if ((sc >= '0') && (sc <= '9')) {
      // ok
    } else {
      PushError("Sign or 0-9 expected, but got '" + std::to_string(sc) +
                "'.\n");
      return false;
    }

    ss << sc;
  }

  if (negative) {
    PushError("Unsigned value expected but got '-' sign.");
    return false;
  }

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if ((c >= '0') && (c <= '9')) {
      ss << c;
    } else {
      _sr->seek_from_current(-1);
      break;
    }
  }

  if (has_sign && (ss.str().size() == 1)) {
    // sign only
    PushError("Integer value expected but got sign character only.\n");
    return false;
  }

  if ((ss.str().size() > 1) && (ss.str()[0] == '0')) {
    PushError("Zero padded integer value is not allowed.\n");
    return false;
  }

  // std::cout << "ReadInt token: " << ss.str() << "\n";

#if defined(__cpp_exceptions) || defined(__EXCEPTIONS)
  try {
    (*value) = uint32_t(std::stoull(ss.str()));
  } catch (const std::invalid_argument &e) {
    (void)e;
    PushError("Not an 64bit unsigned integer literal.\n");
    return false;
  } catch (const std::out_of_range &e) {
    (void)e;
    PushError("64bit unsigned integer value out of range.\n");
    return false;
  }
  return true;
#else
  // use jsteemann/atoi
  int retcode = 0;
  auto result = jsteemann::atoi<uint32_t>(
      ss.str().c_str(), ss.str().c_str() + ss.str().size(), retcode);
  DCOUT("sz = " << ss.str().size());
  DCOUT("ss = " << ss.str() << ", retcode = " << retcode
                << ", result = " << result);
  if (retcode == jsteemann::SUCCESS) {
    (*value) = result;
    return true;
  } else if (retcode == jsteemann::INVALID_INPUT) {
    PushError("Not an 32bit unsigned integer literal.\n");
    return false;
  } else if (retcode == jsteemann::INVALID_NEGATIVE_SIGN) {
    PushError("Negative sign `-` specified for uint32 integer.\n");
    return false;
  } else if (retcode == jsteemann::VALUE_OVERFLOW) {
    PushError("Integer value overflows.\n");
    return false;
  }

  PushError("Invalid integer literal\n");
  return false;
#endif
}